

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cas2_32(void)

{
  uint address;
  uint address_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar3 = m68ki_read_imm_32();
  uVar7 = uVar3 >> 0x10 & 7;
  address = m68ki_cpu.dar[uVar3 >> 0x1c];
  uVar4 = m68ki_read_32_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  address_00 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x3c));
  uVar1 = m68ki_cpu.dar[uVar7];
  uVar5 = m68ki_read_32_fc(address_00,m68ki_address_space | m68ki_cpu.s_flag);
  m68ki_cpu.not_z_flag = uVar4 - uVar1;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  uVar2 = m68ki_cpu.dar[uVar7];
  m68ki_cpu.v_flag = ((m68ki_cpu.not_z_flag ^ uVar4) & (uVar2 ^ uVar4)) >> 0x18;
  m68ki_cpu.c_flag =
       ((m68ki_cpu.not_z_flag | uVar2) & ~uVar4 | uVar2 & m68ki_cpu.not_z_flag) >> 0x17;
  if (uVar4 == uVar1) {
    uVar2 = m68ki_cpu.dar[uVar3 & 7];
    uVar6 = uVar5 - uVar2;
    m68ki_cpu.n_flag = uVar6 >> 0x18;
    m68ki_cpu.v_flag = ((uVar6 ^ uVar5) & (uVar2 ^ uVar5)) >> 0x18;
    m68ki_cpu.c_flag = ((uVar6 | uVar2) & ~uVar5 | uVar6 & uVar2) >> 0x17;
    m68ki_cpu.not_z_flag = uVar5 - uVar2;
    if (m68ki_cpu.not_z_flag == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
      m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,
                        *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 0x14 & 0x1c)));
      m68ki_write_32_fc(address_00,m68ki_cpu.s_flag | 1,
                        *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 4 & 0x1c)));
      return;
    }
  }
  m68ki_cpu.dar[uVar7] = uVar4;
  m68ki_cpu.dar[uVar3 & 7] = uVar5;
  return;
}

Assistant:

static void m68k_op_cas2_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_32(ea1);
		uint res1 = dest1 - *compare1;
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_32(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_32(res1);
		FLAG_Z = MASK_OUT_ABOVE_32(res1);
		FLAG_V = VFLAG_SUB_32(*compare1, dest1, res1);
		FLAG_C = CFLAG_SUB_32(*compare1, dest1, res1);

		if(COND_EQ())
		{
			res2 = dest2 - *compare2;

			FLAG_N = NFLAG_32(res2);
			FLAG_Z = MASK_OUT_ABOVE_32(res2);
			FLAG_V = VFLAG_SUB_32(*compare2, dest2, res2);
			FLAG_C = CFLAG_SUB_32(*compare2, dest2, res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_32(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_32(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
		*compare1 = dest1;
		*compare2 = dest2;
		return;
	}
	m68ki_exception_illegal();
}